

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

void duckdb::DeserializeNumericStatsValue
               (LogicalType *type,NumericValueUnion *result,bool *has_stats,
               Deserializer *deserializer)

{
  PhysicalType PVar1;
  undefined1 uVar2;
  int16_t iVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  InternalException *this;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int32_t extraout_XMM0_Da;
  int64_t extraout_XMM0_Qa;
  string local_48;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"has_value");
  iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  if ((char)iVar4 == '\0') {
    *has_stats = false;
    return;
  }
  *has_stats = true;
  PVar1 = type->physical_type_;
  switch(PVar1) {
  case BOOL:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar4;
    goto LAB_0176eada;
  case UINT8:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    uVar2 = (undefined1)iVar4;
    goto LAB_0176eada;
  case INT8:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0xe])(deserializer);
    uVar2 = (undefined1)iVar4;
LAB_0176eada:
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (result->value_).boolean = (bool)uVar2;
    break;
  case UINT16:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0x11])(deserializer);
    iVar3 = (int16_t)iVar4;
    goto LAB_0176ea4a;
  case INT16:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0x10])(deserializer);
    iVar3 = (int16_t)iVar4;
LAB_0176ea4a:
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (result->value_).smallint = iVar3;
    break;
  case UINT32:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0x13])(deserializer);
    goto LAB_0176eb0e;
  case INT32:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0x12])(deserializer);
LAB_0176eb0e:
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (result->value_).integer = iVar4;
    break;
  case UINT64:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar6 = CONCAT44(extraout_var_00,iVar4);
    goto LAB_0176eba3;
  case INT64:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    iVar4 = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
    iVar6 = CONCAT44(extraout_var_01,iVar4);
LAB_0176eba3:
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (result->value_).bigint = iVar6;
    break;
  case UINT64|UINT8:
switchD_0176e96e_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unsupported type for serializing numeric statistics","");
    InternalException::InternalException(this,&local_48);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    (*deserializer->_vptr_Deserializer[0x18])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (result->value_).integer = extraout_XMM0_Da;
    break;
  case DOUBLE:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
    (*deserializer->_vptr_Deserializer[0x19])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (result->value_).bigint = extraout_XMM0_Qa;
    break;
  default:
    if (PVar1 == UINT128) {
      (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
      iVar4 = (*deserializer->_vptr_Deserializer[0x17])(deserializer);
      iVar5 = CONCAT44(extraout_var_02,iVar4);
      iVar6 = extraout_RDX_00;
    }
    else {
      if (PVar1 != INT128) goto switchD_0176e96e_caseD_a;
      (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
      iVar4 = (*deserializer->_vptr_Deserializer[0x16])(deserializer);
      iVar5 = CONCAT44(extraout_var,iVar4);
      iVar6 = extraout_RDX;
    }
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (result->value_).bigint = iVar5;
    (result->value_).hugeint.upper = iVar6;
  }
  return;
}

Assistant:

static void DeserializeNumericStatsValue(const LogicalType &type, NumericValueUnion &result, bool &has_stats,
                                         Deserializer &deserializer) {
	auto has_value = deserializer.ReadProperty<bool>(100, "has_value");
	if (!has_value) {
		has_stats = false;
		return;
	}
	has_stats = true;
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		result.value_.boolean = deserializer.ReadProperty<bool>(101, "value");
		break;
	case PhysicalType::INT8:
		result.value_.tinyint = deserializer.ReadProperty<int8_t>(101, "value");
		break;
	case PhysicalType::INT16:
		result.value_.smallint = deserializer.ReadProperty<int16_t>(101, "value");
		break;
	case PhysicalType::INT32:
		result.value_.integer = deserializer.ReadProperty<int32_t>(101, "value");
		break;
	case PhysicalType::INT64:
		result.value_.bigint = deserializer.ReadProperty<int64_t>(101, "value");
		break;
	case PhysicalType::UINT8:
		result.value_.utinyint = deserializer.ReadProperty<uint8_t>(101, "value");
		break;
	case PhysicalType::UINT16:
		result.value_.usmallint = deserializer.ReadProperty<uint16_t>(101, "value");
		break;
	case PhysicalType::UINT32:
		result.value_.uinteger = deserializer.ReadProperty<uint32_t>(101, "value");
		break;
	case PhysicalType::UINT64:
		result.value_.ubigint = deserializer.ReadProperty<uint64_t>(101, "value");
		break;
	case PhysicalType::INT128:
		result.value_.hugeint = deserializer.ReadProperty<hugeint_t>(101, "value");
		break;
	case PhysicalType::UINT128:
		result.value_.uhugeint = deserializer.ReadProperty<uhugeint_t>(101, "value");
		break;
	case PhysicalType::FLOAT:
		result.value_.float_ = deserializer.ReadProperty<float>(101, "value");
		break;
	case PhysicalType::DOUBLE:
		result.value_.double_ = deserializer.ReadProperty<double>(101, "value");
		break;
	default:
		throw InternalException("Unsupported type for serializing numeric statistics");
	}
}